

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parent.cpp
# Opt level: O2

string * fs_parent_abi_cxx11_(string *__return_storage_ptr__,string_view path)

{
  _Bool _Var1;
  __type _Var2;
  string_view in;
  string_view path_00;
  string p;
  path local_a0;
  path local_78;
  string local_50;
  string_view path_local;
  
  path_local._M_str = path._M_str;
  path_local._M_len = path._M_len;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&p,&path_local,(allocator<char> *)&local_a0);
  in._M_str = p._M_dataplus._M_p;
  in._M_len = p._M_string_length;
  fs_drop_slash_abi_cxx11_(&local_a0._M_pathname,in);
  std::__cxx11::string::operator=((string *)&p,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_78,&p,auto_format);
  std::filesystem::__cxx11::path::parent_path();
  std::filesystem::__cxx11::path::generic_string(&local_50,&local_a0);
  std::__cxx11::string::operator=((string *)&p,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::filesystem::__cxx11::path::~path(&local_a0);
  std::filesystem::__cxx11::path::~path(&local_78);
  if (p._M_string_length == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,".",(allocator<char> *)&local_a0);
  }
  else {
    _Var1 = fs_is_windows();
    if ((_Var1) && (p._M_string_length != 0)) {
      path_00._M_str = p._M_dataplus._M_p;
      path_00._M_len = p._M_string_length;
      fs_root_name_abi_cxx11_(&local_a0._M_pathname,path_00);
      _Var2 = std::operator==(&p,&local_a0._M_pathname);
      std::__cxx11::string::~string((string *)&local_a0);
      if (_Var2) {
        std::__cxx11::string::push_back((char)&p);
      }
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)p._M_dataplus._M_p == &p.field_2) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(p.field_2._M_allocated_capacity._1_7_,p.field_2._M_local_buf[0]);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = p.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = p._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(p.field_2._M_allocated_capacity._1_7_,p.field_2._M_local_buf[0]);
    }
    __return_storage_ptr__->_M_string_length = p._M_string_length;
    p._M_string_length = 0;
    p.field_2._M_local_buf[0] = '\0';
    p._M_dataplus._M_p = (pointer)&p.field_2;
  }
  std::__cxx11::string::~string((string *)&p);
  return __return_storage_ptr__;
}

Assistant:

std::string fs_parent(std::string_view path)
{

  std::string p(path);

#ifdef HAVE_CXX_FILESYSTEM
  p = fs_drop_slash(p);
  // have to drop trailing slash to get expected parent path -- necessary for AppleClang
  p = std::filesystem::path(p).parent_path().generic_string();

  if(fs_trace) std::cout << "TRACE:parent(" << path << ") => " << p << "\n";

// 30.10.7.1 [fs.path.generic] dot-dot in the root-directory refers to the root-directory itself.
// On Windows, a drive specifier such as "C:" or "z:" is treated as a root-name.
// On Cygwin, a path that begins with two successive directory separators is a root-name.
// Otherwise (for POSIX-like systems other than Cygwin), the implementation-defined root-name
// is an unspecified string which does not appear in any pathnames.

#elif defined(_WIN32)
  p = fs_drop_slash(p);
  std::string dir(_MAX_DIR, '\0');
  std::string drive(_MAX_DRIVE, '\0');
  if(_splitpath_s(p.data(), drive.data(), _MAX_DRIVE, dir.data(), _MAX_DIR, nullptr, 0, nullptr, 0) != 0)
    return {};

  p = fs_drop_slash(fs_trim(drive) + fs_trim(dir));
#else
  char* d = dirname(p.data());
  return d ? d : "";
#endif

  if (p.empty())
    return ".";

  // need this for <filesystem> or _splitpath_s to make x: x:/
  if (fs_is_windows() && !p.empty() && p == fs_root_name(p))
    p.push_back('/');

  return p;
}